

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

int xmlNormalizeURIPath(char *path)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  char cVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  
  pcVar2 = path;
  if (path == (char *)0x0) {
    return -1;
  }
  for (; cVar5 = *pcVar2, cVar5 == '/'; pcVar2 = pcVar2 + 1) {
  }
  pcVar3 = pcVar2;
  if (cVar5 == '\0') {
    return 0;
  }
  while( true ) {
    while ((cVar6 = cVar5, cVar5 == '.' && (cVar6 = pcVar3[1], pcVar3[1] == '/'))) {
      pcVar3 = pcVar3 + 1;
      do {
        cVar5 = pcVar3[1];
        pcVar3 = pcVar3 + 1;
      } while (cVar5 == '/');
    }
    if (cVar6 == '\0') break;
    while( true ) {
      if (cVar5 == '\0') goto LAB_0018b1e0;
      if (cVar5 == '/') break;
      *pcVar2 = cVar5;
      pcVar2 = pcVar2 + 1;
      cVar5 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    }
    do {
      pcVar7 = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
    } while (*pcVar7 == '/');
    *pcVar2 = '/';
    pcVar2 = pcVar2 + 1;
    cVar5 = *pcVar3;
  }
LAB_0018b1e0:
  *pcVar2 = '\0';
  for (pcVar3 = path; *pcVar3 == '/'; pcVar3 = pcVar3 + 1) {
  }
  if (*pcVar3 == '\0') {
    return 0;
  }
LAB_0018b1fb:
  do {
    do {
      lVar8 = 0;
      pcVar7 = pcVar3 + 4;
      while( true ) {
        if (pcVar7[-4] == '\0') goto LAB_0018b2bb;
        if (pcVar7[-4] == '/') break;
        lVar8 = lVar8 + -1;
        pcVar7 = pcVar7 + 1;
      }
      if ((((*pcVar3 == '.') && (pcVar3[1] == '.' && lVar8 == -2)) || (pcVar7[-3] != '.')) ||
         (pcVar7[-2] != '.')) {
LAB_0018b2a5:
        pcVar3 = pcVar3 + (1 - lVar8);
        goto LAB_0018b1fb;
      }
      if (pcVar7[-1] != '/') {
        if (pcVar7[-1] != '\0') goto LAB_0018b2a5;
        *pcVar3 = '\0';
LAB_0018b2bb:
        *pcVar2 = '\0';
        if (*path != '/') {
          return 0;
        }
        lVar8 = 0;
        goto LAB_0018b2c5;
      }
      lVar8 = 0;
      do {
        cVar5 = pcVar7[lVar8];
        pcVar3[lVar8] = cVar5;
        lVar8 = lVar8 + 1;
        pcVar9 = pcVar3;
      } while (cVar5 != '\0');
      do {
        pcVar7 = pcVar9;
        if (pcVar9 <= path) break;
        pcVar7 = pcVar9 + -1;
        pcVar1 = pcVar9 + -1;
        pcVar9 = pcVar7;
      } while (*pcVar1 == '/');
    } while (pcVar7 == path);
    do {
      pcVar3 = pcVar7;
      if (pcVar3 <= path) break;
      pcVar7 = pcVar3 + -1;
    } while (pcVar3[-1] != '/');
  } while( true );
  while( true ) {
    lVar8 = lVar4 + 3;
    if (path[lVar4 + 3] != '/') break;
LAB_0018b2c5:
    lVar4 = lVar8;
    if ((path[lVar4 + 1] != '.') || (path[lVar4 + 2] != '.')) goto LAB_0018b2f0;
  }
  if (path[lVar4 + 3] != '\0') {
LAB_0018b2f0:
    lVar8 = lVar4;
    if (lVar4 == 0) {
      return 0;
    }
  }
  pcVar2 = path + lVar8;
  cVar5 = *pcVar2;
  while (cVar5 != '\0') {
    pcVar2 = pcVar2 + 1;
    *path = cVar5;
    path = path + 1;
    cVar5 = *pcVar2;
  }
  *path = '\0';
  return 0;
}

Assistant:

int
xmlNormalizeURIPath(char *path) {
    char *cur, *out;

    if (path == NULL)
	return(-1);

    /* Skip all initial "/" chars.  We want to get to the beginning of the
     * first non-empty segment.
     */
    cur = path;
    while (cur[0] == '/')
      ++cur;
    if (cur[0] == '\0')
      return(0);

    /* Keep everything we've seen so far.  */
    out = cur;

    /*
     * Analyze each segment in sequence for cases (c) and (d).
     */
    while (cur[0] != '\0') {
	/*
	 * c) All occurrences of "./", where "." is a complete path segment,
	 *    are removed from the buffer string.
	 */
	if ((cur[0] == '.') && (cur[1] == '/')) {
	    cur += 2;
	    /* '//' normalization should be done at this point too */
	    while (cur[0] == '/')
		cur++;
	    continue;
	}

	/*
	 * d) If the buffer string ends with "." as a complete path segment,
	 *    that "." is removed.
	 */
	if ((cur[0] == '.') && (cur[1] == '\0'))
	    break;

	/* Otherwise keep the segment.  */
	while (cur[0] != '/') {
            if (cur[0] == '\0')
              goto done_cd;
	    (out++)[0] = (cur++)[0];
	}
	/* normalize // */
	while ((cur[0] == '/') && (cur[1] == '/'))
	    cur++;

        (out++)[0] = (cur++)[0];
    }
 done_cd:
    out[0] = '\0';

    /* Reset to the beginning of the first segment for the next sequence.  */
    cur = path;
    while (cur[0] == '/')
      ++cur;
    if (cur[0] == '\0')
	return(0);

    /*
     * Analyze each segment in sequence for cases (e) and (f).
     *
     * e) All occurrences of "<segment>/../", where <segment> is a
     *    complete path segment not equal to "..", are removed from the
     *    buffer string.  Removal of these path segments is performed
     *    iteratively, removing the leftmost matching pattern on each
     *    iteration, until no matching pattern remains.
     *
     * f) If the buffer string ends with "<segment>/..", where <segment>
     *    is a complete path segment not equal to "..", that
     *    "<segment>/.." is removed.
     *
     * To satisfy the "iterative" clause in (e), we need to collapse the
     * string every time we find something that needs to be removed.  Thus,
     * we don't need to keep two pointers into the string: we only need a
     * "current position" pointer.
     */
    while (1) {
        char *segp, *tmp;

        /* At the beginning of each iteration of this loop, "cur" points to
         * the first character of the segment we want to examine.
         */

        /* Find the end of the current segment.  */
        segp = cur;
        while ((segp[0] != '/') && (segp[0] != '\0'))
          ++segp;

        /* If this is the last segment, we're done (we need at least two
         * segments to meet the criteria for the (e) and (f) cases).
         */
        if (segp[0] == '\0')
          break;

        /* If the first segment is "..", or if the next segment _isn't_ "..",
         * keep this segment and try the next one.
         */
        ++segp;
        if (((cur[0] == '.') && (cur[1] == '.') && (segp == cur+3))
            || ((segp[0] != '.') || (segp[1] != '.')
                || ((segp[2] != '/') && (segp[2] != '\0')))) {
          cur = segp;
          continue;
        }

        /* If we get here, remove this segment and the next one and back up
         * to the previous segment (if there is one), to implement the
         * "iteratively" clause.  It's pretty much impossible to back up
         * while maintaining two pointers into the buffer, so just compact
         * the whole buffer now.
         */

        /* If this is the end of the buffer, we're done.  */
        if (segp[2] == '\0') {
          cur[0] = '\0';
          break;
        }
        /* Valgrind complained, strcpy(cur, segp + 3); */
        /* string will overlap, do not use strcpy */
        tmp = cur;
        segp += 3;
        while ((*tmp++ = *segp++) != 0)
          ;

        /* If there are no previous segments, then keep going from here.  */
        segp = cur;
        while ((segp > path) && ((--segp)[0] == '/'))
          ;
        if (segp == path)
          continue;

        /* "segp" is pointing to the end of a previous segment; find it's
         * start.  We need to back up to the previous segment and start
         * over with that to handle things like "foo/bar/../..".  If we
         * don't do this, then on the first pass we'll remove the "bar/..",
         * but be pointing at the second ".." so we won't realize we can also
         * remove the "foo/..".
         */
        cur = segp;
        while ((cur > path) && (cur[-1] != '/'))
          --cur;
    }
    out[0] = '\0';

    /*
     * g) If the resulting buffer string still begins with one or more
     *    complete path segments of "..", then the reference is
     *    considered to be in error. Implementations may handle this
     *    error by retaining these components in the resolved path (i.e.,
     *    treating them as part of the final URI), by removing them from
     *    the resolved path (i.e., discarding relative levels above the
     *    root), or by avoiding traversal of the reference.
     *
     * We discard them from the final path.
     */
    if (path[0] == '/') {
      cur = path;
      while ((cur[0] == '/') && (cur[1] == '.') && (cur[2] == '.')
             && ((cur[3] == '/') || (cur[3] == '\0')))
	cur += 3;

      if (cur != path) {
	out = path;
	while (cur[0] != '\0')
          (out++)[0] = (cur++)[0];
	out[0] = 0;
      }
    }

    return(0);
}